

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

void __thiscall
cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::~MemPool
          (MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *this)

{
  size_type segmentSize;
  MemSegment *pMVar1;
  PtrAVLTree *local_48;
  size_type size;
  void *ptr;
  MemSegment *seg;
  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *this_local;
  
  ptr = this->m_segList;
  while (ptr != (void *)0x0) {
    segmentSize = MemSegment::getSize((MemSegment *)ptr);
    pMVar1 = MemSegment::getNext((MemSegment *)ptr);
    NoActionMemLogger::logFreeSegment(this->m_logger,ptr,segmentSize);
    MallocArena::freeSegment(this->m_arena,ptr,segmentSize);
    ptr = pMVar1;
  }
  local_48 = (PtrAVLTree *)&this->m_footprint;
  do {
    local_48 = local_48 + -1;
    PtrAVLTree::~PtrAVLTree(local_48);
  } while (local_48 != this->m_largeTrees);
  return;
}

Assistant:

~MemPool()
    {
        MemSegment* seg = m_segList;
        while (seg)
        {
            void* ptr = seg;
            size_type size = seg->getSize ();
            seg = seg->getNext ();
            m_logger.logFreeSegment (ptr, size);
            m_arena.freeSegment (ptr, size);
        }
    }